

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::ZeroConstraint::ZeroConstraint(ZeroConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::ZeroConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::ZeroConstraint> *)0x2536e8);
  std::__cxx11::string::operator=(in_RDI,"zero");
  return;
}

Assistant:

ZeroConstraint() { this->description_ = "zero"; }